

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void wiener_filter_stripe_highbd
               (RestorationUnitInfo *rui,int stripe_width,int stripe_height,int procunit_width,
               uint8_t *src8,int src_stride,uint8_t *dst8,int dst_stride,int32_t *tmpbuf,
               int bit_depth,aom_internal_error_info *error_info)

{
  uint uVar1;
  WienerConvolveParams WVar2;
  uint uVar3;
  long lVar4;
  WienerConvolveParams conv_params;
  
  WVar2.round_0 = bit_depth + -7;
  WVar2.round_1 = 0x15 - bit_depth;
  conv_params.round_0 = 3;
  conv_params.round_1 = 0xb;
  if (10 < bit_depth) {
    conv_params = WVar2;
  }
  if (0 < stripe_width) {
    uVar3 = stripe_width + 0xf;
    lVar4 = 0;
    do {
      uVar1 = uVar3 & 0xfffffff0;
      if (procunit_width <= (int)(uVar3 & 0xfffffff0)) {
        uVar1 = procunit_width;
      }
      (*av1_highbd_wiener_convolve_add_src)
                (src8 + lVar4,(long)src_stride,dst8 + lVar4,(long)dst_stride,
                 (rui->wiener_info).hfilter,0x10,(rui->wiener_info).vfilter,0x10,uVar1,stripe_height
                 ,&conv_params,bit_depth);
      lVar4 = lVar4 + procunit_width;
      uVar3 = uVar3 - procunit_width;
    } while (lVar4 < (long)(ulong)(uint)stripe_width);
  }
  return;
}

Assistant:

static void wiener_filter_stripe_highbd(
    const RestorationUnitInfo *rui, int stripe_width, int stripe_height,
    int procunit_width, const uint8_t *src8, int src_stride, uint8_t *dst8,
    int dst_stride, int32_t *tmpbuf, int bit_depth,
    struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)error_info;
  const WienerConvolveParams conv_params = get_conv_params_wiener(bit_depth);

  for (int j = 0; j < stripe_width; j += procunit_width) {
    int w = AOMMIN(procunit_width, (stripe_width - j + 15) & ~15);
    const uint8_t *src8_p = src8 + j;
    uint8_t *dst8_p = dst8 + j;
    av1_highbd_wiener_convolve_add_src(src8_p, src_stride, dst8_p, dst_stride,
                                       rui->wiener_info.hfilter, 16,
                                       rui->wiener_info.vfilter, 16, w,
                                       stripe_height, &conv_params, bit_depth);
  }
}